

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso8859_9.c
# Opt level: O0

int mbc_case_fold(OnigCaseFoldType flag,OnigUChar **pp,OnigUChar *end,OnigUChar *lower)

{
  byte *pbVar1;
  OnigUChar *p;
  OnigUChar *lower_local;
  OnigUChar *end_local;
  OnigUChar **pp_local;
  OnigCaseFoldType flag_local;
  
  pbVar1 = *pp;
  if ((*pbVar1 == 0xdf) && ((flag & 0x40000000) != 0)) {
    *lower = 's';
    lower[1] = 's';
    *pp = *pp + 1;
    pp_local._4_4_ = 2;
  }
  else {
    if (((flag & 1) == 0) || (*pbVar1 < 0x80)) {
      *lower = ""[*pbVar1];
    }
    else {
      *lower = *pbVar1;
    }
    *pp = *pp + 1;
    pp_local._4_4_ = 1;
  }
  return pp_local._4_4_;
}

Assistant:

static int
mbc_case_fold(OnigCaseFoldType flag,
              const UChar** pp, const UChar* end ARG_UNUSED, UChar* lower)
{
  const UChar* p = *pp;

  if (*p == 0xdf && (flag & INTERNAL_ONIGENC_CASE_FOLD_MULTI_CHAR) != 0) {
    *lower++ = 's';
    *lower   = 's';
    (*pp)++;
    return 2;
  }

  if (CASE_FOLD_IS_NOT_ASCII_ONLY(flag) || ONIGENC_IS_ASCII_CODE(*p))
    *lower = ENC_ISO_8859_9_TO_LOWER_CASE(*p);
  else
    *lower = *p;

  (*pp)++;
  return 1;
}